

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  ulong uVar1;
  U32 maxDist_00;
  U32 UVar2;
  uint uVar3;
  void *pvVar4;
  void *src_00;
  size_t sVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  ZSTD_window_t *in_RDI;
  ulong in_R8;
  U32 correction;
  U32 ldmHSize;
  size_t prevSize;
  size_t newLeftoverSize;
  size_t chunkSize;
  BYTE *chunkEnd;
  size_t remaining;
  BYTE *chunkStart;
  size_t leftoverSize;
  size_t chunk;
  size_t nbChunks;
  size_t kMaxChunkSize;
  BYTE *iend;
  BYTE *istart;
  U32 maxDist;
  size_t in_stack_00000138;
  void *in_stack_00000140;
  ldmParams_t *in_stack_00000148;
  rawSeqStore_t *in_stack_00000150;
  ldmState_t *in_stack_00000158;
  void *srcEnd;
  void *src_01;
  U32 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  U32 in_stack_ffffffffffffff60;
  size_t local_68;
  ulong local_60;
  
  maxDist_00 = 1 << ((byte)*(undefined4 *)(in_RDX + 0x14) & 0x1f);
  pvVar4 = (void *)(in_RCX + in_R8);
  local_68 = 0;
  if (in_RDI->nextSrc < (BYTE *)(in_RCX + in_R8)) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e57,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if ((ulong)in_RSI[1] <= (ulong)in_RSI[3]) {
    if ((ulong)in_RSI[4] < (ulong)in_RSI[3]) {
      __assert_fail("sequences->size <= sequences->capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7e5c,
                    "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                   );
    }
    local_60 = 0;
    while( true ) {
      uVar3 = in_stack_ffffffffffffff5c & 0xffffff;
      if (local_60 < (in_R8 >> 0x14) + (long)(int)(uint)((in_R8 & 0xfffff) != 0)) {
        uVar3 = CONCAT13((ulong)in_RSI[3] < (ulong)in_RSI[4],(int3)in_stack_ffffffffffffff5c);
      }
      in_stack_ffffffffffffff5c = uVar3;
      if ((char)(in_stack_ffffffffffffff5c >> 0x18) == '\0') {
        return 0;
      }
      src_00 = (void *)(in_RCX + local_60 * 0x100000);
      srcEnd = pvVar4;
      if (0xfffff < (ulong)((long)pvVar4 - (long)src_00)) {
        srcEnd = (void *)((long)src_00 + 0x100000);
      }
      uVar1 = in_RSI[3];
      if (pvVar4 <= src_00) break;
      src_01 = srcEnd;
      UVar2 = ZSTD_window_needOverflowCorrection
                        (*in_RDI,0,maxDist_00,*(U32 *)&in_RDI[1].base,src_00,srcEnd);
      if (UVar2 != 0) {
        UVar2 = 1 << ((byte)*(undefined4 *)(in_RDX + 4) & 0x1f);
        in_stack_ffffffffffffff60 =
             ZSTD_window_correctOverflow
                       ((ZSTD_window_t *)CONCAT44(UVar2,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,src_01);
        ZSTD_ldm_reduceTable((ldmEntry_t *)in_RDI[1].nextSrc,UVar2,in_stack_ffffffffffffff60);
        *(undefined4 *)&in_RDI[1].base = 0;
      }
      ZSTD_window_enforceMaxDist
                (in_RDI,srcEnd,maxDist_00,(U32 *)&in_RDI[1].base,(ZSTD_matchState_t **)0x0);
      sVar5 = ZSTD_ldm_generateSequences_internal
                        (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                         in_stack_00000138);
      uVar3 = ZSTD_isError(0x2e6b79);
      if (uVar3 != 0) {
        return sVar5;
      }
      if (uVar1 < (ulong)in_RSI[3]) {
        lVar6 = *in_RSI + uVar1 * 0xc;
        *(int *)(lVar6 + 4) = (int)local_68 + *(int *)(lVar6 + 4);
        local_68 = sVar5;
      }
      else {
        if (sVar5 != (long)srcEnd - (long)src_00) {
          __assert_fail("newLeftoverSize == chunkSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7e8d,
                        "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                       );
        }
        local_68 = ((long)srcEnd - (long)src_00) + local_68;
      }
      local_60 = local_60 + 1;
    }
    __assert_fail("chunkStart < iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7e66,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  __assert_fail("sequences->pos <= sequences->size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x7e5b,
                "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}